

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

AddBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_addbroadcastable(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x370) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x370;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    AddBroadcastableLayerParams::AddBroadcastableLayerParams(this_00.addbroadcastable_);
    (this->layer_).addbroadcastable_ = (AddBroadcastableLayerParams *)this_00;
  }
  return (AddBroadcastableLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::AddBroadcastableLayerParams* NeuralNetworkLayer::mutable_addbroadcastable() {
  if (!has_addbroadcastable()) {
    clear_layer();
    set_has_addbroadcastable();
    layer_.addbroadcastable_ = new ::CoreML::Specification::AddBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.addBroadcastable)
  return layer_.addbroadcastable_;
}